

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O3

void duckdb::VarPopOperation::Finalize<double,duckdb::StddevState>
               (StddevState *state,double *target,AggregateFinalizeData *finalize_data)

{
  uint64_t uVar1;
  bool bVar2;
  OutOfRangeException *this;
  double value;
  undefined1 auVar3 [16];
  string local_40;
  
  uVar1 = state->count;
  if (uVar1 == 1) {
    value = 0.0;
  }
  else {
    if (uVar1 == 0) {
      AggregateFinalizeData::ReturnNull(finalize_data);
      return;
    }
    auVar3._8_4_ = (int)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    value = state->dsquared /
            ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  }
  *target = value;
  bVar2 = Value::DoubleIsFinite(value);
  if (bVar2) {
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"VARPOP is out of range!","");
  OutOfRangeException::OutOfRangeException(this,&local_40);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			target = state.count > 1 ? (state.dsquared / state.count) : 0;
			if (!Value::DoubleIsFinite(target)) {
				throw OutOfRangeException("VARPOP is out of range!");
			}
		}
	}